

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O1

XMLTranscoder * __thiscall
xercesc_4_0::ICUTransService::makeNewXMLTranscoder
          (ICUTransService *this,XMLCh *encodingName,Codes *resValue,XMLSize_t blockSize,
          MemoryManager *manager)

{
  short *psVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  XMLCh *toDelete;
  UConverter *toAdopt;
  ICUTranscoder *this_00;
  long lVar5;
  XMLCh *pXVar6;
  int iVar7;
  ulong uVar8;
  UErrorCode uerr;
  ArrayJanitor<char16_t> janTmp1;
  ArrayJanitor<char16_t> janTmp;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var;
  
  if (encodingName == (XMLCh *)0x0) {
    iVar7 = -4;
  }
  else {
    uVar8 = 0;
    do {
      psVar1 = (short *)((long)encodingName + uVar8);
      uVar8 = uVar8 + 2;
    } while (*psVar1 != 0);
    iVar7 = (int)(uVar8 >> 1) + -5;
  }
  bVar3 = XMLString::regionMatches(encodingName,iVar7,(XMLCh *)gs390Id,0,4);
  if (!bVar3) {
    if (encodingName == (XMLCh *)0x0) {
      iVar7 = -4;
    }
    else {
      uVar8 = 0;
      do {
        psVar1 = (short *)((long)encodingName + uVar8);
        uVar8 = uVar8 + 2;
      } while (*psVar1 != 0);
      iVar7 = (int)(uVar8 >> 1) + -5;
    }
    toDelete = (char16_t *)0x0;
    bVar3 = XMLString::regionMatches(encodingName,iVar7,(XMLCh *)gS390Id,0,4);
    pXVar6 = encodingName;
    if (!bVar3) goto LAB_00348c48;
  }
  if (encodingName == (XMLCh *)0x0) {
    lVar5 = 0xc;
  }
  else {
    lVar4 = 10;
    do {
      lVar5 = lVar4 + 2;
      lVar2 = lVar4 + -10;
      lVar4 = lVar5;
    } while (*(short *)((long)encodingName + lVar2) != 0);
  }
  iVar7 = (*manager->_vptr_MemoryManager[3])(manager,lVar5);
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar7);
  if (encodingName == (XMLCh *)0x0) {
    lVar5 = -4;
  }
  else {
    lVar5 = 0;
    do {
      psVar1 = (short *)((long)encodingName + lVar5);
      lVar5 = lVar5 + 2;
    } while (*psVar1 != 0);
    lVar5 = (lVar5 >> 1) + -5;
  }
  memmove(toDelete,encodingName,lVar5 * 2);
  memcpy(toDelete + lVar5,gswaplfnlId,0x12);
  pXVar6 = toDelete;
LAB_00348c48:
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,(char16_t *)0x0,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_50,toDelete,manager);
  toAdopt = (UConverter *)ucnv_openU_70(pXVar6);
  if (toAdopt == (UConverter *)0x0) {
    *resValue = UnsupportedEncoding;
    this_00 = (ICUTranscoder *)0x0;
  }
  else {
    this_00 = (ICUTranscoder *)XMemory::operator_new(0x38,manager);
    ICUTranscoder::ICUTranscoder(this_00,encodingName,toAdopt,blockSize,manager);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return &this_00->super_XMLTranscoder;
}

Assistant:

XMLTranscoder* ICUTransService::
makeNewXMLTranscoder(const  XMLCh* const            encodingName
                    ,       XMLTransService::Codes& resValue
                    , const XMLSize_t               blockSize
                    ,       MemoryManager* const    manager)
{
    //
    //  For encodings that end with "s390" we need to strip off the "s390"
    //  from the encoding name and add ",swaplfnl" to the encoding name
    //  that we pass into ICU on the ucnv_openU.
    //
    XMLCh* encodingNameToUse = (XMLCh*) encodingName;
    XMLCh* workBuffer = 0;

    if ( (XMLString::endsWith(encodingNameToUse, gs390Id)) ||
         (XMLString::endsWith(encodingNameToUse, gS390Id)) )
    {
       XMLSize_t workBufferSize = (XMLString::stringLen(encodingNameToUse) + XMLString::stringLen(gswaplfnlId) - XMLString::stringLen(gS390Id) + 1);
       workBuffer = (XMLCh*) manager->allocate(workBufferSize * sizeof(XMLCh));
       XMLSize_t moveSize = XMLString::stringLen(encodingNameToUse) - XMLString::stringLen(gS390Id);
       XMLString::moveChars(workBuffer, encodingNameToUse, moveSize);
       XMLString::moveChars((workBuffer + moveSize), gswaplfnlId, XMLString::stringLen(gswaplfnlId));
       encodingNameToUse = workBuffer;
    }

    //
    //  If UChar and XMLCh are not the same size, then we have premassage the
    //  encoding name into a UChar type string.
    //
    const UChar* actualName;
    UChar* tmpName = 0;
    if (sizeof(UChar) == sizeof(XMLCh))
    {
        actualName = (const UChar*)encodingNameToUse;
    }
    else
    {
        tmpName = convertToUChar(encodingNameToUse, 0, manager);
        actualName = tmpName;
    }

    ArrayJanitor<UChar> janTmp(tmpName, manager);
    ArrayJanitor<XMLCh> janTmp1(workBuffer, manager);

    UErrorCode uerr = U_ZERO_ERROR;
    UConverter* converter = ucnv_openU(actualName, &uerr);
    if (!converter)
    {
        resValue = XMLTransService::UnsupportedEncoding;
        return 0;
    }

    return new (manager) ICUTranscoder(encodingName, converter, blockSize, manager);
}